

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool cinemo::isValidFileType(string *file,char *ext)

{
  char *__s1;
  int iVar1;
  string local_68 [32];
  long local_48;
  size_type i;
  string fileExt;
  char *ext_local;
  string *file_local;
  
  std::__cxx11::string::string((string *)&i);
  local_48 = std::__cxx11::string::rfind((char)file,0x2e);
  if (local_48 == -1) {
    file_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_68,(ulong)file);
    std::__cxx11::string::operator=((string *)&i,local_68);
    std::__cxx11::string::~string(local_68);
    __s1 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcasecmp(__s1,ext);
    file_local._7_1_ = (bool)((iVar1 != 0 ^ 0xffU) & 1);
  }
  std::__cxx11::string::~string((string *)&i);
  return file_local._7_1_;
}

Assistant:

bool isValidFileType(const string& file, const char* ext) {
        string fileExt;
        string::size_type i;

        i = file.rfind('.');

        if (i != string::npos) {
            fileExt = file.substr(i + 1);
            return !strcasecmp(fileExt.c_str(), ext);
        }

        return false;
    }